

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_inlines.h
# Opt level: O2

void extent_init(extent_t *extent,arena_t *arena,void *addr,size_t size,_Bool slab,szind_t szind,
                size_t sn,extent_state_t state,_Bool zeroed,_Bool committed,_Bool dumpable)

{
  ulong uVar1;
  
  if (arena == (arena_t *)0x0) {
    uVar1 = 0xfff;
  }
  else {
    uVar1 = (ulong)(arena->base->ind & 0xfc000fff);
  }
  extent->e_addr = addr;
  (extent->field_2).e_size_esn = (uint)(extent->field_2).e_size_esn & 0xfff | size;
  extent->e_bits =
       (sn << 0x2a) +
       (((ulong)szind & 0xffffff) << 0x12 | (ulong)slab << 0xc | uVar1 |
       extent->e_bits & 0x3fffc000000) + 0x6000;
  (extent->ql_link).qre_next = extent;
  (extent->ql_link).qre_prev = extent;
  return;
}

Assistant:

static inline void
extent_init(extent_t *extent, arena_t *arena, void *addr, size_t size,
    bool slab, szind_t szind, size_t sn, extent_state_t state, bool zeroed,
    bool committed, bool dumpable) {
	assert(addr == PAGE_ADDR2BASE(addr) || !slab);

	extent_arena_set(extent, arena);
	extent_addr_set(extent, addr);
	extent_size_set(extent, size);
	extent_slab_set(extent, slab);
	extent_szind_set(extent, szind);
	extent_sn_set(extent, sn);
	extent_state_set(extent, state);
	extent_zeroed_set(extent, zeroed);
	extent_committed_set(extent, committed);
	extent_dumpable_set(extent, dumpable);
	ql_elm_new(extent, ql_link);
	if (config_prof) {
		extent_prof_tctx_set(extent, NULL);
	}
}